

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

Variant * Jinx::Impl::WriteLine
                    (Variant *__return_storage_ptr__,ScriptPtr *param_1,Parameters *params)

{
  Variant *var;
  
  var = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
        super__Vector_impl_data._M_start;
  if (var != (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
             super__Vector_impl_data._M_finish) {
    DebugWriteInternal(Info,var);
  }
  LogWrite(Info,"\n");
  __return_storage_ptr__->m_type = Null;
  Variant::Destroy(__return_storage_ptr__);
  __return_storage_ptr__->m_type = Null;
  return __return_storage_ptr__;
}

Assistant:

inline Variant WriteLine(ScriptPtr, const Parameters & params)
	{
		if (!params.empty())
			DebugWriteInternal(LogLevel::Info, params[0]);
		LogWrite(LogLevel::Info, "\n");
		return nullptr;
	}